

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

char * __thiscall leveldb::Arena::Allocate(Arena *this,size_t bytes)

{
  char *pcVar1;
  
  if (bytes == 0) {
    __assert_fail("bytes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/arena.h"
                  ,0x3b,"char *leveldb::Arena::Allocate(size_t)");
  }
  if (this->alloc_bytes_remaining_ < bytes) {
    pcVar1 = AllocateFallback(this,bytes);
    return pcVar1;
  }
  pcVar1 = this->alloc_ptr_;
  this->alloc_ptr_ = pcVar1 + bytes;
  this->alloc_bytes_remaining_ = this->alloc_bytes_remaining_ - bytes;
  return pcVar1;
}

Assistant:

inline char* Arena::Allocate(size_t bytes) {
  // The semantics of what to return are a bit messy if we allow
  // 0-byte allocations, so we disallow them here (we don't need
  // them for our internal use).
  assert(bytes > 0);
  if (bytes <= alloc_bytes_remaining_) {
    char* result = alloc_ptr_;
    alloc_ptr_ += bytes;
    alloc_bytes_remaining_ -= bytes;
    return result;
  }
  return AllocateFallback(bytes);
}